

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compact_functional_test.cc
# Opt level: O1

void compact_upto_with_circular_reuse_test(void)

{
  fdb_kvs_handle *handle;
  fdb_status fVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  fdb_config *__s;
  fdb_config *fconfig;
  ulong unaff_RBP;
  ulong uVar5;
  char *pcVar6;
  char *unaff_R12;
  ulong unaff_R13;
  ulong uVar7;
  uint uVar8;
  ulong unaff_R14;
  fdb_config *unaff_R15;
  fdb_file_handle *dbfile;
  fdb_doc *doc;
  uint64_t num_markers;
  fdb_snapshot_info_t *markers_out;
  fdb_kvs_handle *db [3];
  timeval __test_begin;
  char valuebuf [512];
  char keybuf [256];
  fdb_file_handle *pfStackY_930;
  fdb_snapshot_info_t *pfStackY_928;
  uint64_t uStackY_920;
  fdb_kvs_handle *pfStackY_918;
  fdb_kvs_config fStackY_910;
  timeval tStackY_8f8;
  fdb_config fStackY_8e8;
  char acStackY_7f0 [256];
  char acStackY_6f0 [520];
  fdb_config *pfStackY_4e8;
  char *pcStackY_4e0;
  ulong uStackY_4d8;
  ulong uStackY_4d0;
  fdb_config *pfStackY_4c8;
  code *pcStackY_4c0;
  int local_4a4;
  fdb_file_handle *local_4a0;
  fdb_config *local_498;
  ulong local_490;
  int local_484;
  fdb_snapshot_info_t *local_480;
  fdb_kvs_handle *local_478 [4];
  fdb_kvs_config local_458;
  timeval local_440;
  fdb_config local_430;
  char local_338 [256];
  undefined1 local_238;
  fdb_config local_138;
  
  pcStackY_4c0 = (code *)0x113cb0;
  gettimeofday(&local_440,(__timezone_ptr_t)0x0);
  pcStackY_4c0 = (code *)0x113cb5;
  memleak_start();
  pcStackY_4c0 = (code *)0x113cc1;
  system("rm -rf  compact_test* > errorlog.txt");
  fconfig = &local_430;
  pcStackY_4c0 = (code *)0x113cd1;
  fdb_get_default_config();
  local_430.buffercache_size = 0;
  local_430.num_keeping_headers = 10;
  pcStackY_4c0 = (code *)0x113cee;
  fdb_get_default_kvs_config();
  pcStackY_4c0 = (code *)0x113d02;
  fVar1 = fdb_open(&local_4a0,"compact_test",fconfig);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140a7;
  pcStackY_4c0 = (code *)0x113d20;
  fVar1 = fdb_kvs_open(local_4a0,local_478,(char *)0x0,&local_458);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140ac;
  pcStackY_4c0 = (code *)0x113d43;
  fVar1 = fdb_kvs_open(local_4a0,local_478 + 1,"db1",&local_458);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140b1;
  pcStackY_4c0 = (code *)0x113d66;
  fVar1 = fdb_kvs_open(local_4a0,local_478 + 2,"db2",&local_458);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140b6;
  pcStackY_4c0 = (code *)0x113d88;
  memset(local_338,0x78,0x100);
  local_238 = 0;
  local_4a4 = 0;
  do {
    unaff_RBP = 0;
    iVar2 = 0;
    do {
      unaff_R15 = (fdb_config *)0x1;
      local_484 = iVar2;
      do {
        unaff_R14 = 0;
        do {
          unaff_R13 = (ulong)(uint)((int)unaff_R14 + (int)unaff_RBP);
          __s = &local_138;
          pcStackY_4c0 = (code *)0x113dc8;
          sprintf((char *)__s,"k%06d",unaff_R13);
          unaff_R12 = local_338;
          pcStackY_4c0 = (code *)0x113dec;
          sprintf(unaff_R12,"v%d_%04d_%d",(ulong)unaff_R15 & 0xffffffff);
          pcStackY_4c0 = (code *)0x113e0e;
          fVar1 = fdb_doc_create((fdb_doc **)&local_498,__s,8,(void *)0x0,0,unaff_R12,0x101);
          if (fVar1 != FDB_RESULT_SUCCESS) {
            pcStackY_4c0 = (code *)0x114079;
            compact_upto_with_circular_reuse_test();
LAB_00114079:
            pcStackY_4c0 = (code *)0x11407e;
            compact_upto_with_circular_reuse_test();
LAB_0011407e:
            pcStackY_4c0 = (code *)0x114083;
            compact_upto_with_circular_reuse_test();
            goto LAB_00114083;
          }
          pcStackY_4c0 = (code *)0x113e25;
          fVar1 = fdb_set(local_478[(long)unaff_R15],(fdb_doc *)local_498);
          if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114079;
          pcStackY_4c0 = (code *)0x113e37;
          fVar1 = fdb_doc_free((fdb_doc *)local_498);
          if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011407e;
          uVar8 = (int)unaff_R14 + 1;
          unaff_R14 = (ulong)uVar8;
        } while (uVar8 != 100);
        unaff_R15 = (fdb_config *)((long)&unaff_R15->chunksize + 1);
      } while (unaff_R15 != (fdb_config *)0x3);
      pcStackY_4c0 = (code *)0x113e65;
      fVar1 = fdb_commit(local_4a0,'\0');
      fconfig = __s;
      if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140a2;
      iVar2 = local_484 + 1;
      unaff_RBP = (ulong)((int)unaff_RBP + 100);
    } while (iVar2 != 0x40);
    local_4a4 = local_4a4 + 1;
  } while (local_4a4 != 4);
  pcStackY_4c0 = (code *)0x113ea6;
  fVar1 = fdb_get_all_snap_markers(local_4a0,&local_480,&local_490);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140c0;
  if (local_430.num_keeping_headers < local_490) {
    pcStackY_4c0 = (code *)0x113ecf;
    compact_upto_with_circular_reuse_test();
  }
  pcStackY_4c0 = (code *)0x113ee9;
  fVar1 = fdb_compact_upto(local_4a0,"compact_test_compact",local_480[5].marker);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140c5;
  pcStackY_4c0 = (code *)0x113f00;
  fVar1 = fdb_free_snap_markers(local_480,local_490);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140ca;
  unaff_R12 = local_338;
  unaff_R13 = 0;
  iVar2 = 0;
  do {
    unaff_RBP = 1;
    do {
      unaff_R14 = 0;
      do {
        __s = (fdb_config *)(ulong)(uint)((int)unaff_R14 + (int)unaff_R13);
        unaff_R15 = &local_138;
        pcStackY_4c0 = (code *)0x113f40;
        sprintf((char *)unaff_R15,"k%06d",__s);
        pcStackY_4c0 = (code *)0x113f5b;
        sprintf(unaff_R12,"v%d_%04d_%d",unaff_RBP & 0xffffffff);
        pcStackY_4c0 = (code *)0x113f7d;
        fVar1 = fdb_doc_create((fdb_doc **)&local_498,unaff_R15,8,(void *)0x0,0,(void *)0x0,0);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114083;
        pcStackY_4c0 = (code *)0x113f94;
        fVar1 = fdb_get(local_478[unaff_RBP],(fdb_doc *)local_498);
        fconfig = local_498;
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114088;
        unaff_R15 = *(fdb_config **)&local_498->multi_kv_instances;
        pcStackY_4c0 = (code *)0x113fb4;
        iVar3 = bcmp(unaff_R15,unaff_R12,local_498->wal_threshold);
        if (iVar3 != 0) goto LAB_0011408d;
        pcStackY_4c0 = (code *)0x113fc4;
        fVar1 = fdb_doc_free((fdb_doc *)fconfig);
        if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011409d;
        uVar8 = (int)unaff_R14 + 1;
        unaff_R14 = (ulong)uVar8;
      } while (uVar8 != 100);
      unaff_RBP = unaff_RBP + 1;
    } while (unaff_RBP != 3);
    pcStackY_4c0 = (code *)0x113ff2;
    fVar1 = fdb_commit(local_4a0,'\0');
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140bb;
    iVar2 = iVar2 + 1;
    unaff_R13 = (ulong)((int)unaff_R13 + 100);
  } while (iVar2 != 0x40);
  pcStackY_4c0 = (code *)0x114017;
  fVar1 = fdb_close(local_4a0);
  if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_001140cf;
  pcStackY_4c0 = (code *)0x114024;
  fVar1 = fdb_shutdown();
  if (fVar1 == FDB_RESULT_SUCCESS) {
    pcStackY_4c0 = (code *)0x114031;
    memleak_end();
    pcVar6 = "%s PASSED\n";
    if (compact_upto_with_circular_reuse_test()::__test_pass != '\0') {
      pcVar6 = "%s FAILED\n";
    }
    pcStackY_4c0 = (code *)0x114062;
    fprintf(_stderr,pcVar6,"compact upto with circular reuse test");
    return;
  }
  goto LAB_001140d4;
LAB_00114083:
  pcStackY_4c0 = (code *)0x114088;
  compact_upto_with_circular_reuse_test();
LAB_00114088:
  fconfig = __s;
  pcStackY_4c0 = (code *)0x11408d;
  compact_upto_with_circular_reuse_test();
LAB_0011408d:
  pcStackY_4c0 = (code *)0x11409d;
  compact_upto_with_circular_reuse_test();
LAB_0011409d:
  pcStackY_4c0 = (code *)0x1140a2;
  compact_upto_with_circular_reuse_test();
LAB_001140a2:
  unaff_R12 = local_338;
  pcStackY_4c0 = (code *)0x1140a7;
  compact_upto_with_circular_reuse_test();
LAB_001140a7:
  pcStackY_4c0 = (code *)0x1140ac;
  compact_upto_with_circular_reuse_test();
LAB_001140ac:
  pcStackY_4c0 = (code *)0x1140b1;
  compact_upto_with_circular_reuse_test();
LAB_001140b1:
  pcStackY_4c0 = (code *)0x1140b6;
  compact_upto_with_circular_reuse_test();
LAB_001140b6:
  pcStackY_4c0 = (code *)0x1140bb;
  compact_upto_with_circular_reuse_test();
LAB_001140bb:
  pcStackY_4c0 = (code *)0x1140c0;
  compact_upto_with_circular_reuse_test();
LAB_001140c0:
  pcStackY_4c0 = (code *)0x1140c5;
  compact_upto_with_circular_reuse_test();
LAB_001140c5:
  pcStackY_4c0 = (code *)0x1140ca;
  compact_upto_with_circular_reuse_test();
LAB_001140ca:
  pcStackY_4c0 = (code *)0x1140cf;
  compact_upto_with_circular_reuse_test();
LAB_001140cf:
  pcStackY_4c0 = (code *)0x1140d4;
  compact_upto_with_circular_reuse_test();
LAB_001140d4:
  pcStackY_4c0 = compact_upto_last_wal_flush_bid_check;
  compact_upto_with_circular_reuse_test();
  pfStackY_4e8 = fconfig;
  pcStackY_4e0 = unaff_R12;
  uStackY_4d8 = unaff_R13;
  uStackY_4d0 = unaff_R14;
  pfStackY_4c8 = unaff_R15;
  pcStackY_4c0 = (code *)unaff_RBP;
  gettimeofday(&tStackY_8f8,(__timezone_ptr_t)0x0);
  memleak_start();
  system("rm -rf  compact_test* > errorlog.txt");
  fdb_get_default_config();
  fStackY_8e8.num_keeping_headers = 0x14;
  fdb_get_default_kvs_config();
  fVar1 = fdb_open(&pfStackY_930,"compact_test",&fStackY_8e8);
  if (fVar1 == FDB_RESULT_SUCCESS) {
    fVar1 = fdb_kvs_open(pfStackY_930,&pfStackY_918,"db",&fStackY_910);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114316;
    memset(acStackY_6f0,0x78,200);
    uVar5 = 0;
    do {
      uVar7 = 0;
      do {
        sprintf(acStackY_7f0,"k%06d",uVar7);
        sprintf(acStackY_6f0,"v%d_%04d",uVar5,uVar7);
        handle = pfStackY_918;
        sVar4 = strlen(acStackY_7f0);
        fVar1 = fdb_set_kv(handle,acStackY_7f0,sVar4 + 1,acStackY_6f0,200);
        if (fVar1 != FDB_RESULT_SUCCESS) {
          compact_upto_last_wal_flush_bid_check();
          goto LAB_0011430c;
        }
        uVar8 = (int)uVar7 + 1;
        uVar7 = (ulong)uVar8;
      } while (uVar8 != 1000);
      fVar1 = fdb_commit(pfStackY_930,'\x01');
      if (fVar1 != FDB_RESULT_SUCCESS) {
LAB_0011430c:
        compact_upto_last_wal_flush_bid_check();
        goto LAB_00114311;
      }
      uVar8 = (int)uVar5 + 1;
      uVar5 = (ulong)uVar8;
    } while (uVar8 != 0x14);
    fVar1 = fdb_get_all_snap_markers(pfStackY_930,&pfStackY_928,&uStackY_920);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_0011431b;
    fVar1 = fdb_compact_upto(pfStackY_930,"compact_test2",pfStackY_928[0xf].marker);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114320;
    fdb_free_snap_markers(pfStackY_928,uStackY_920);
    fVar1 = fdb_get_all_snap_markers(pfStackY_930,&pfStackY_928,&uStackY_920);
    if (fVar1 != FDB_RESULT_SUCCESS) goto LAB_00114325;
    fVar1 = fdb_compact_upto(pfStackY_930,"compact_test3",pfStackY_928[0xf].marker);
    if (fVar1 == FDB_RESULT_SUCCESS) {
      fdb_free_snap_markers(pfStackY_928,uStackY_920);
      fVar1 = fdb_close(pfStackY_930);
      if (fVar1 == FDB_RESULT_SUCCESS) {
        fdb_shutdown();
        memleak_end();
        pcVar6 = "%s PASSED\n";
        if (compact_upto_last_wal_flush_bid_check()::__test_pass != '\0') {
          pcVar6 = "%s FAILED\n";
        }
        fprintf(_stderr,pcVar6,"compact upto last WAL flush bid check test");
        return;
      }
      goto LAB_0011432f;
    }
  }
  else {
LAB_00114311:
    compact_upto_last_wal_flush_bid_check();
LAB_00114316:
    compact_upto_last_wal_flush_bid_check();
LAB_0011431b:
    compact_upto_last_wal_flush_bid_check();
LAB_00114320:
    compact_upto_last_wal_flush_bid_check();
LAB_00114325:
    compact_upto_last_wal_flush_bid_check();
  }
  compact_upto_last_wal_flush_bid_check();
LAB_0011432f:
  compact_upto_last_wal_flush_bid_check();
  compact_deleted_doc_test();
  iVar2 = 0;
  compact_upto_test(false);
  compact_upto_test(true);
  compact_upto_last_wal_flush_bid_check();
  wal_delete_compact_upto_test();
  compact_upto_with_circular_reuse_test();
  do {
    compact_upto_overwrite_test(iVar2);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 4);
  compact_with_snapshot_open_multi_kvs_test();
  compact_with_snapshot_open_test();
  compact_upto_post_snapshot_test();
  compact_upto_twice_test();
  compaction_callback_test(true);
  compaction_callback_test(false);
  compact_wo_reopen_test();
  compact_with_reopen_test();
  compact_reopen_with_iterator();
  compact_reopen_named_kvs();
  estimate_space_upto_test(false);
  estimate_space_upto_test(true);
  unlink_after_compaction_test();
  db_compact_overwrite();
  db_compact_during_doc_delete((void *)0x0);
  compaction_with_concurrent_transaction_test();
  compaction_with_concurrent_update_test();
  auto_compaction_with_custom_cmp_function();
  compaction_daemon_test(0x14);
  auto_compaction_with_concurrent_insert_test(0x14);
  compaction_cancellation_test(COMPACTION_CANCEL_MODE);
  return;
}

Assistant:

void compact_upto_with_circular_reuse_test()
{
    TEST_INIT();
    int batch=100, n_batch=64, n_dbs=3, i, j, r, k, idx;
    int n_repeat = 4;
    fdb_file_handle *dbfile;
    fdb_kvs_handle *db[3];
    fdb_config config;
    fdb_kvs_config kvs_config;
    fdb_doc *doc;
    fdb_status s; (void)s;
    char keybuf[256], valuebuf[512];

    memleak_start();

    // remove previous dummy files
    r = system(SHELL_DEL" compact_test* > errorlog.txt");
    (void)r;

    config = fdb_get_default_config();
    config.buffercache_size = 0;
    config.num_keeping_headers = 10;
    kvs_config = fdb_get_default_kvs_config();

    // create a file
    s = fdb_open(&dbfile, "compact_test", &config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[0], NULL, &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[1], "db1", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_kvs_open(dbfile, &db[2], "db2", &kvs_config);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memset(valuebuf, 'x', 256);
    valuebuf[256] = 0;
    for (k=0; k<n_repeat; ++k) {
        for (r=0; r<n_batch; ++r) {
            for (j=1; j<n_dbs; ++j) {
                for (i=0; i<batch; ++i) {
                    idx = r*batch + i;
                    sprintf(keybuf, "k%06d", idx);
                    sprintf(valuebuf, "v%d_%04d_%d", j, idx, k);
                    s = fdb_doc_create(&doc, keybuf, 8, NULL, 0, valuebuf, 257);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    s = fdb_set(db[j], doc);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                    s = fdb_doc_free(doc);
                    TEST_CHK(s == FDB_RESULT_SUCCESS);
                }
            }
            s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
            TEST_CHK(s == FDB_RESULT_SUCCESS);
        }
    }

    fdb_snapshot_info_t *markers_out;
    uint64_t num_markers;

    s = fdb_get_all_snap_markers(dbfile, &markers_out, &num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // num_markers should be equal to or smaller than num_keeping_headers
    TEST_CHK(num_markers <= config.num_keeping_headers);

    s = fdb_compact_upto(dbfile, "compact_test_compact", markers_out[5].marker);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_free_snap_markers(markers_out, num_markers);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    // all docs should be retrieved correclty.
    k = n_repeat - 1;
    for (r=0; r<n_batch; ++r) {
        for (j=1; j<n_dbs; ++j) {
            for (i=0; i<batch; ++i) {
                idx = r*batch + i;
                sprintf(keybuf, "k%06d", idx);
                sprintf(valuebuf, "v%d_%04d_%d", j, idx, k);
                s = fdb_doc_create(&doc, keybuf, 8, NULL, 0, NULL, 0);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                s = fdb_get(db[j], doc);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
                TEST_CMP(doc->body, valuebuf, doc->bodylen);
                s = fdb_doc_free(doc);
                TEST_CHK(s == FDB_RESULT_SUCCESS);
            }
        }
        s = fdb_commit(dbfile, FDB_COMMIT_NORMAL);
        TEST_CHK(s == FDB_RESULT_SUCCESS);
    }

    s = fdb_close(dbfile);
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    s = fdb_shutdown();
    TEST_CHK(s == FDB_RESULT_SUCCESS);

    memleak_end();

    TEST_RESULT("compact upto with circular reuse test");
}